

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O1

factor * __thiscall
merlin::factor::maxmarginal(factor *__return_storage_ptr__,factor *this,variable_set *target)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  double dVar4;
  subindex s;
  subindex local_60;
  
  variable_set::operator&((variable_set *)&local_60,target,&this->v_);
  factor(__return_storage_ptr__,(variable_set *)&local_60,-INFINITY);
  variable_set::~variable_set((variable_set *)&local_60);
  subindex::subindex(&local_60,&this->v_,&__return_storage_ptr__->v_);
  pdVar2 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish != pdVar2) {
    uVar3 = 0;
    do {
      pdVar1 = (__return_storage_ptr__->t_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar4 = pdVar1[local_60.m_idx];
      if (dVar4 <= pdVar2[uVar3]) {
        dVar4 = pdVar2[uVar3];
      }
      pdVar1[local_60.m_idx] = dVar4;
      uVar3 = uVar3 + 1;
      subindex::operator++(&local_60);
      pdVar2 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->t_).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3));
  }
  subindex::~subindex(&local_60);
  return __return_storage_ptr__;
}

Assistant:

factor maxmarginal(variable_set const& target) const {
		factor F(target & vars(), -infty());
		subindex s(v_, F.vars());
		for (size_t i = 0; i < num_states(); ++i, ++s)
			F[s] = (F[s] > t_[i]) ? F[s] : t_[i];
		return F;
	}